

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall
Builder::ExtractDeps
          (Builder *this,Result *result,string *deps_type,string *deps_prefix,
          vector<Node_*,_std::allocator<Node_*>_> *deps_nodes,string *err)

{
  bool bVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  int *piVar4;
  char *__rhs;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  string output;
  CLParser parser;
  string content;
  uint64_t slash_bits;
  allocator<char> local_12a;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [16];
  _Base_ptr local_f8;
  _Rb_tree_node_base *local_f0;
  _Rb_tree_node_base *local_e8;
  pointer local_e0;
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = std::operator==(deps_type,"msvc");
  if (bVar1) {
    p_Var6 = (_Rb_tree_node_base *)(local_108 + 8);
    local_108._8_4_ = _S_red;
    local_f8 = (_Base_ptr)0x0;
    local_e0 = (pointer)0x0;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_f0 = p_Var6;
    local_e8 = p_Var6;
    bVar1 = CLParser::Parse((CLParser *)local_108,&result->output,deps_prefix,&local_128,err);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&result->output);
      for (p_Var3 = local_f0; p_Var3 != p_Var6;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        local_d0._0_8_ = State::GetNode(this->state_,*(StringPiece *)(p_Var3 + 1),0xffffffff);
        std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                  ((vector<Node*,std::allocator<Node*>> *)deps_nodes,(Node **)local_d0);
      }
      std::__cxx11::string::~string((string *)&local_128);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108);
      return true;
    }
    std::__cxx11::string::~string((string *)&local_128);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
    return false;
  }
  bVar1 = std::operator==(deps_type,"gcc");
  if (!bVar1) {
    Fatal("unknown deps type \'%s\'",(deps_type->_M_dataplus)._M_p);
  }
  Edge::GetUnescapedDepfile_abi_cxx11_(&local_128,result->edge);
  if (local_128._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"edge with deps=gcc but no depfile makes no sense",
               (allocator<char> *)local_d0);
    std::__cxx11::string::operator=((string *)err,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    bVar1 = false;
    bVar5 = false;
    goto LAB_0010907d;
  }
  local_d0._0_8_ = local_d0 + 0x10;
  local_d0._8_8_ = 0;
  local_d0[0x10] = '\0';
  iVar2 = (**(code **)(*(long *)this->disk_interface_ + 0x10))
                    (this->disk_interface_,&local_128,local_d0,err);
  if (iVar2 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_00108ec8:
    if (local_d0._8_8_ != 0) {
      DepfileParser::DepfileParser((DepfileParser *)local_108);
      bVar1 = DepfileParser::Parse((DepfileParser *)local_108,(string *)local_d0,err);
      if (bVar1) {
        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                  (deps_nodes,(long)local_e8 - (long)local_f0 >> 4);
        for (p_Var6 = local_f0; p_Var6 != local_e8; p_Var6 = (_Rb_tree_node_base *)&p_Var6->_M_left)
        {
          bVar1 = CanonicalizePath(*(char **)p_Var6,(size_t *)&p_Var6->_M_parent,
                                   (uint64_t *)&local_50,err);
          if (!bVar1) goto LAB_00109065;
          local_b0[0]._0_8_ =
               State::GetNode(this->state_,*(StringPiece *)p_Var6,
                              (uint64_t)local_50._M_dataplus._M_p);
          std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                    ((vector<Node*,std::allocator<Node*>> *)deps_nodes,
                     (Node **)&local_b0[0]._M_allocated_capacity);
        }
        bVar1 = true;
        if ((g_keep_depfile == false) &&
           (iVar2 = (**(code **)(*(long *)this->disk_interface_ + 0x30))
                              (this->disk_interface_,&local_128), iVar2 < 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"deleting depfile: ",&local_129);
          piVar4 = __errno_location();
          __rhs = strerror(*piVar4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,&local_70,__rhs);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\n",&local_12a);
          std::operator+(&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,&local_90);
          std::__cxx11::string::operator=((string *)err,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)local_b0[0]._M_local_buf);
          std::__cxx11::string::~string((string *)&local_70);
          goto LAB_00109065;
        }
      }
      else {
LAB_00109065:
        bVar1 = false;
      }
      DepfileParser::~DepfileParser((DepfileParser *)local_108);
      goto LAB_00109071;
    }
    bVar5 = true;
    bVar1 = false;
  }
  else {
    if (iVar2 != 2) goto LAB_00108ec8;
    bVar1 = false;
LAB_00109071:
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)local_d0);
LAB_0010907d:
  std::__cxx11::string::~string((string *)&local_128);
  if (bVar1) {
    return true;
  }
  return bVar5;
}

Assistant:

bool Builder::ExtractDeps(CommandRunner::Result* result,
                          const string& deps_type,
                          const string& deps_prefix,
                          vector<Node*>* deps_nodes,
                          string* err) {
  if (deps_type == "msvc") {
    CLParser parser;
    string output;
    if (!parser.Parse(result->output, deps_prefix, &output, err))
      return false;
    result->output = output;
    for (set<string>::iterator i = parser.includes_.begin();
         i != parser.includes_.end(); ++i) {
      // ~0 is assuming that with MSVC-parsed headers, it's ok to always make
      // all backslashes (as some of the slashes will certainly be backslashes
      // anyway). This could be fixed if necessary with some additional
      // complexity in IncludesNormalize::Relativize.
      deps_nodes->push_back(state_->GetNode(*i, ~0u));
    }
  } else if (deps_type == "gcc") {
    string depfile = result->edge->GetUnescapedDepfile();
    if (depfile.empty()) {
      *err = string("edge with deps=gcc but no depfile makes no sense");
      return false;
    }

    // Read depfile content.  Treat a missing depfile as empty.
    string content;
    switch (disk_interface_->ReadFile(depfile, &content, err)) {
    case DiskInterface::Okay:
      break;
    case DiskInterface::NotFound:
      err->clear();
      break;
    case DiskInterface::OtherError:
      return false;
    }
    if (content.empty())
      return true;

    DepfileParser deps(config_.depfile_parser_options);
    if (!deps.Parse(&content, err))
      return false;

    // XXX check depfile matches expected output.
    deps_nodes->reserve(deps.ins_.size());
    for (vector<StringPiece>::iterator i = deps.ins_.begin();
         i != deps.ins_.end(); ++i) {
      uint64_t slash_bits;
      if (!CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits,
                            err))
        return false;
      deps_nodes->push_back(state_->GetNode(*i, slash_bits));
    }

    if (!g_keep_depfile) {
      if (disk_interface_->RemoveFile(depfile) < 0) {
        *err = string("deleting depfile: ") + strerror(errno) + string("\n");
        return false;
      }
    }
  } else {
    Fatal("unknown deps type '%s'", deps_type.c_str());
  }

  return true;
}